

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetExportName_abi_cxx11_(string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  bool bVar1;
  char *__s;
  ostream *poVar2;
  ostringstream e;
  string local_1c0;
  string local_1a0 [11];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a0,"EXPORT_NAME",(allocator<char> *)&local_1c0);
  __s = GetProperty(this,local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  if ((__s == (char *)0x0) || (*__s == '\0')) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Target->Name);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a0,__s,(allocator<char> *)&local_1c0);
    bVar1 = cmGeneratorExpression::IsValidTargetName(local_1a0);
    std::__cxx11::string::~string((string *)local_1a0);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,(allocator<char> *)local_1a0);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      poVar2 = std::operator<<((ostream *)local_1a0,"EXPORT_NAME property \"");
      poVar2 = std::operator<<(poVar2,__s);
      poVar2 = std::operator<<(poVar2,"\" for \"");
      poVar2 = std::operator<<(poVar2,(string *)&this->Target->Name);
      std::operator<<(poVar2,"\": is not valid.");
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_1c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetExportName() const
{
  const char* exportName = this->GetProperty("EXPORT_NAME");

  if (exportName && *exportName) {
    if (!cmGeneratorExpression::IsValidTargetName(exportName)) {
      std::ostringstream e;
      e << "EXPORT_NAME property \"" << exportName << "\" for \""
        << this->GetName() << "\": is not valid.";
      cmSystemTools::Error(e.str());
      return "";
    }
    return exportName;
  }
  return this->GetName();
}